

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_bson_document(void)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int __fd;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  bson_t ochild;
  undefined1 local_180 [4];
  uint local_17c;
  
  lVar4 = bcon_new(0,"bar","baz",0);
  uVar5 = bson_bcon_magic();
  uVar5 = bcon_new(0,"foo",uVar5,2,lVar4,0);
  uVar6 = bson_bcone_magic();
  cVar2 = bcon_extract(uVar5,"foo",uVar6,2,local_180,0);
  if (cVar2 == '\0') {
    pcVar8 = "BCON_EXTRACT (bcon, \"foo\", BCONE_DOCUMENT (ochild))";
    uVar5 = 0x131;
  }
  else {
    __buf = (void *)bson_get_data(local_180);
    __buf_00 = (void *)bson_get_data(lVar4);
    if (*(uint *)(lVar4 + 4) == local_17c) {
      __s1 = (void *)bson_get_data(lVar4);
      __s2 = (void *)bson_get_data(local_180);
      iVar3 = bcmp(__s1,__s2,(ulong)*(uint *)(lVar4 + 4));
      if (iVar3 == 0) {
        bson_destroy(local_180);
        bson_destroy(lVar4);
        bson_destroy(uVar5);
        return;
      }
    }
    uVar5 = bson_as_canonical_extended_json(local_180,0);
    uVar6 = bson_as_canonical_extended_json(lVar4,0);
    uVar1 = *(uint *)(lVar4 + 4);
    for (uVar9 = 0; (local_17c != (uint)uVar9 && ((uint)uVar9 < uVar1)); uVar9 = uVar9 + 1) {
      if (*(char *)((long)__buf + uVar9) != *(char *)((long)__buf_00 + uVar9)) {
        uVar9 = uVar9 & 0xffffffff;
        goto LAB_0013505b;
      }
    }
    uVar7 = local_17c;
    if (local_17c < uVar1) {
      uVar7 = uVar1;
    }
    uVar9 = (ulong)(uVar7 - 1);
LAB_0013505b:
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar5,uVar6);
    iVar3 = open("failure.bad.bson",0x42,0x1a0);
    __fd = open("failure.expected.bson",0x42,0x1a0);
    if (iVar3 == -1) {
      pcVar8 = "fd1 != -1";
    }
    else if (__fd == -1) {
      pcVar8 = "fd2 != -1";
    }
    else {
      uVar9 = write(iVar3,__buf,(ulong)local_17c);
      if (uVar9 == local_17c) {
        uVar1 = *(uint *)(lVar4 + 4);
        uVar9 = write(__fd,__buf_00,(ulong)uVar1);
        if (uVar9 == uVar1) {
          close(iVar3);
          close(__fd);
          pcVar8 = "0";
        }
        else {
          pcVar8 = "(child)->len == bson_write (fd2, expected_data, (child)->len)";
        }
      }
      else {
        pcVar8 = "(&ochild)->len == bson_write (fd1, bson_data, (&ochild)->len)";
      }
    }
    uVar5 = 0x133;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar5,"test_bson_document",pcVar8);
  abort();
}

Assistant:

static void
test_bson_document (void)
{
   bson_t ochild;
   bson_t *child = BCON_NEW ("bar", "baz");
   bson_t *bcon = BCON_NEW ("foo", BCON_DOCUMENT (child));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_DOCUMENT (ochild)));

   bson_eq_bson (&ochild, child);

   bson_destroy (&ochild);
   bson_destroy (child);
   bson_destroy (bcon);
}